

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_encoder.cc
# Opt level: O1

bool __thiscall draco::PlyEncoder::EncodeInternal(PlyEncoder *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  EncoderBuffer *pEVar4;
  __uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> _Var5;
  pointer paVar6;
  char cVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  ostream *poVar11;
  size_t sVar12;
  Mesh *extraout_RAX;
  Mesh *pMVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  undefined1 uVar17;
  char *pcVar18;
  _Head_base<0UL,_draco::PointAttribute_*,_false> _Var19;
  ulong uVar20;
  uint *puVar21;
  ulong uVar22;
  string header_str;
  stringstream out;
  undefined1 local_1fd;
  uint local_1fc;
  _Head_base<0UL,_draco::PointAttribute_*,_false> local_1f8;
  uint local_1ec;
  ulong local_1e8;
  ulong local_1e0;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ply",3);
  cVar7 = (char)(ostream *)local_1a8;
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"format binary_little_endian 1.0",0x1f);
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"element vertex ",0xf);
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  uVar9 = PointCloud::GetNamedAttributeId(this->in_point_cloud_,POSITION);
  uVar10 = PointCloud::GetNamedAttributeId(this->in_point_cloud_,NORMAL);
  local_1fc = PointCloud::GetNamedAttributeId(this->in_point_cloud_,TEX_COORD);
  local_1ec = PointCloud::GetNamedAttributeId(this->in_point_cloud_,COLOR);
  if ((int)uVar9 < 0) {
    uVar17 = 0;
    goto LAB_0011ef41;
  }
  if ((-1 < (int)uVar10) &&
     (*(char *)((long)(this->in_point_cloud_->attributes_).
                      super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_t.
                      super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                      ._M_t + 0x18) != '\x03')) {
    uVar10 = 0xffffffff;
  }
  if ((-1 < (int)local_1fc) &&
     (*(char *)((long)(this->in_point_cloud_->attributes_).
                      super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[local_1fc]._M_t.
                      super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                      ._M_t + 0x18) != '\x02')) {
    local_1fc = 0xffffffff;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"property ",9);
  iVar1 = *(int *)((long)(this->in_point_cloud_->attributes_).
                         super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar9]._M_t.
                         super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                         ._M_t + 0x1c);
  if (iVar1 == 9) {
    pcVar18 = "float";
LAB_0011e287:
    bVar8 = false;
  }
  else {
    if (iVar1 == 5) {
      pcVar18 = "int";
      goto LAB_0011e287;
    }
    if (iVar1 == 2) {
      pcVar18 = "uchar";
      goto LAB_0011e287;
    }
    bVar8 = true;
    pcVar18 = (char *)0x0;
  }
  iVar1 = (int)(ostream *)local_1a8;
  if (bVar8) {
    std::ios::clear(iVar1 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
  }
  else {
    sVar12 = strlen(pcVar18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar18,sVar12);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," x",2);
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"property ",9);
  iVar2 = *(int *)((long)(this->in_point_cloud_->attributes_).
                         super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar9]._M_t.
                         super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                         ._M_t + 0x1c);
  if (iVar2 == 9) {
    pcVar18 = "float";
LAB_0011e350:
    bVar8 = false;
  }
  else {
    if (iVar2 == 5) {
      pcVar18 = "int";
      goto LAB_0011e350;
    }
    if (iVar2 == 2) {
      pcVar18 = "uchar";
      goto LAB_0011e350;
    }
    bVar8 = true;
    pcVar18 = (char *)0x0;
  }
  if (bVar8) {
    std::ios::clear(iVar1 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
  }
  else {
    sVar12 = strlen(pcVar18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar18,sVar12);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," y",2);
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"property ",9);
  iVar2 = *(int *)((long)(this->in_point_cloud_->attributes_).
                         super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar9]._M_t.
                         super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                         ._M_t + 0x1c);
  if (iVar2 == 9) {
    pcVar18 = "float";
LAB_0011e419:
    bVar8 = false;
  }
  else {
    if (iVar2 == 5) {
      pcVar18 = "int";
      goto LAB_0011e419;
    }
    if (iVar2 == 2) {
      pcVar18 = "uchar";
      goto LAB_0011e419;
    }
    bVar8 = true;
    pcVar18 = (char *)0x0;
  }
  if (bVar8) {
    std::ios::clear(iVar1 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
  }
  else {
    sVar12 = strlen(pcVar18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar18,sVar12);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," z",2);
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  local_1e8 = (ulong)uVar10;
  if (-1 < (int)uVar10) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"property ",9);
    iVar2 = *(int *)((long)(this->in_point_cloud_->attributes_).
                           super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_1e8]._M_t.
                           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                           ._M_t + 0x1c);
    if (iVar2 == 9) {
      pcVar18 = "float";
LAB_0011e4f8:
      bVar8 = false;
    }
    else {
      if (iVar2 == 5) {
        pcVar18 = "int";
        goto LAB_0011e4f8;
      }
      if (iVar2 == 2) {
        pcVar18 = "uchar";
        goto LAB_0011e4f8;
      }
      bVar8 = true;
      pcVar18 = (char *)0x0;
    }
    if (bVar8) {
      std::ios::clear(iVar1 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
    }
    else {
      sVar12 = strlen(pcVar18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar18,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," nx",3);
    std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar7);
    std::ostream::put(cVar7);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"property ",9);
    iVar2 = *(int *)((long)(this->in_point_cloud_->attributes_).
                           super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_1e8]._M_t.
                           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                           ._M_t + 0x1c);
    if (iVar2 == 9) {
      pcVar18 = "float";
LAB_0011e5c6:
      bVar8 = false;
    }
    else {
      if (iVar2 == 5) {
        pcVar18 = "int";
        goto LAB_0011e5c6;
      }
      if (iVar2 == 2) {
        pcVar18 = "uchar";
        goto LAB_0011e5c6;
      }
      bVar8 = true;
      pcVar18 = (char *)0x0;
    }
    if (bVar8) {
      std::ios::clear(iVar1 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
    }
    else {
      sVar12 = strlen(pcVar18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar18,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ny",3);
    std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar7);
    std::ostream::put(cVar7);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"property ",9);
    iVar2 = *(int *)((long)(this->in_point_cloud_->attributes_).
                           super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_1e8]._M_t.
                           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                           ._M_t + 0x1c);
    if (iVar2 == 9) {
      pcVar18 = "float";
LAB_0011e694:
      bVar8 = false;
    }
    else {
      if (iVar2 == 5) {
        pcVar18 = "int";
        goto LAB_0011e694;
      }
      if (iVar2 == 2) {
        pcVar18 = "uchar";
        goto LAB_0011e694;
      }
      bVar8 = true;
      pcVar18 = (char *)0x0;
    }
    if (bVar8) {
      std::ios::clear(iVar1 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
    }
    else {
      sVar12 = strlen(pcVar18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar18,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," nz",3);
    std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar7);
    std::ostream::put(cVar7);
    std::ostream::flush();
  }
  uVar22 = (ulong)local_1ec;
  if (-1 < (int)local_1ec) {
    _Var19._M_head_impl =
         *(PointAttribute **)
          &(this->in_point_cloud_->attributes_).
           super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar22]._M_t.
           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
           ._M_t;
    local_1f8._M_head_impl = _Var19._M_head_impl;
    if (*(char *)((long)_Var19._M_head_impl + 0x18) != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"property ",9);
      iVar2 = *(int *)((long)(this->in_point_cloud_->attributes_).
                             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar22]._M_t.
                             super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                             ._M_t + 0x1c);
      if (iVar2 == 9) {
        pcVar18 = "float";
LAB_0011e788:
        bVar8 = false;
      }
      else {
        if (iVar2 == 5) {
          pcVar18 = "int";
          goto LAB_0011e788;
        }
        if (iVar2 == 2) {
          pcVar18 = "uchar";
          goto LAB_0011e788;
        }
        bVar8 = true;
        pcVar18 = (char *)0x0;
      }
      if (bVar8) {
        std::ios::clear(iVar1 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
      }
      else {
        sVar12 = strlen(pcVar18);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar18,sVar12);
      }
      _Var19._M_head_impl = local_1f8._M_head_impl;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," red",4);
      std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar7);
      std::ostream::put(cVar7);
      std::ostream::flush();
    }
    if (1 < *(uint8_t *)((long)&(_Var19._M_head_impl)->super_GeometryAttribute + 0x18)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"property ",9);
      iVar2 = *(int *)((long)(this->in_point_cloud_->attributes_).
                             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar22]._M_t.
                             super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                             ._M_t + 0x1c);
      if (iVar2 == 9) {
        pcVar18 = "float";
LAB_0011e866:
        bVar8 = false;
      }
      else {
        if (iVar2 == 5) {
          pcVar18 = "int";
          goto LAB_0011e866;
        }
        if (iVar2 == 2) {
          pcVar18 = "uchar";
          goto LAB_0011e866;
        }
        bVar8 = true;
        pcVar18 = (char *)0x0;
      }
      if (bVar8) {
        std::ios::clear(iVar1 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
      }
      else {
        sVar12 = strlen(pcVar18);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar18,sVar12);
      }
      _Var19._M_head_impl = local_1f8._M_head_impl;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," green",6);
      std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar7);
      std::ostream::put(cVar7);
      std::ostream::flush();
    }
    if (2 < *(byte *)((long)_Var19._M_head_impl + 0x18)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"property ",9);
      iVar2 = *(int *)((long)(this->in_point_cloud_->attributes_).
                             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar22]._M_t.
                             super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                             ._M_t + 0x1c);
      if (iVar2 == 9) {
        pcVar18 = "float";
LAB_0011e944:
        bVar8 = false;
      }
      else {
        if (iVar2 == 5) {
          pcVar18 = "int";
          goto LAB_0011e944;
        }
        if (iVar2 == 2) {
          pcVar18 = "uchar";
          goto LAB_0011e944;
        }
        bVar8 = true;
        pcVar18 = (char *)0x0;
      }
      if (bVar8) {
        std::ios::clear(iVar1 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
      }
      else {
        sVar12 = strlen(pcVar18);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar18,sVar12);
      }
      _Var19._M_head_impl = local_1f8._M_head_impl;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," blue",5);
      std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar7);
      std::ostream::put(cVar7);
      std::ostream::flush();
    }
    if (3 < *(uint8_t *)((long)&(_Var19._M_head_impl)->super_GeometryAttribute + 0x18)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"property ",9);
      iVar2 = *(int *)((long)(this->in_point_cloud_->attributes_).
                             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar22]._M_t.
                             super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                             ._M_t + 0x1c);
      if (iVar2 == 9) {
        pcVar18 = "float";
LAB_0011ea22:
        bVar8 = false;
      }
      else {
        if (iVar2 == 5) {
          pcVar18 = "int";
          goto LAB_0011ea22;
        }
        if (iVar2 == 2) {
          pcVar18 = "uchar";
          goto LAB_0011ea22;
        }
        bVar8 = true;
        pcVar18 = (char *)0x0;
      }
      if (bVar8) {
        std::ios::clear(iVar1 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
      }
      else {
        sVar12 = strlen(pcVar18);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar18,sVar12);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," alpha",6);
      std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar7);
      std::ostream::put(cVar7);
      std::ostream::flush();
    }
  }
  if (this->in_mesh_ != (Mesh *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"element face ",0xd);
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"property list uchar int vertex_indices",0x26);
    std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar7);
    std::ostream::put(cVar7);
    std::ostream::flush();
    if (-1 < (int)local_1fc) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"property list uchar ",0x14);
      iVar2 = *(int *)((long)(this->in_point_cloud_->attributes_).
                             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[local_1fc]._M_t.
                             super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                             ._M_t + 0x1c);
      if (iVar2 == 9) {
        pcVar18 = "float";
LAB_0011eba4:
        bVar8 = false;
      }
      else {
        if (iVar2 == 5) {
          pcVar18 = "int";
          goto LAB_0011eba4;
        }
        if (iVar2 == 2) {
          pcVar18 = "uchar";
          goto LAB_0011eba4;
        }
        bVar8 = true;
        pcVar18 = (char *)0x0;
      }
      if (bVar8) {
        std::ios::clear(iVar1 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
      }
      else {
        sVar12 = strlen(pcVar18);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar18,sVar12);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," texcoord",9);
      std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar7);
      std::ostream::put(cVar7);
      std::ostream::flush();
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"end_header",10);
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  pEVar4 = this->out_buffer_;
  if (pEVar4->bit_encoder_reserved_bytes_ < 1) {
    std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
              ((vector<char,std::allocator<char>> *)pEVar4,
               (pEVar4->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish,local_1d8,local_1d0 + (long)local_1d8);
  }
  uVar3 = this->in_point_cloud_->num_points_;
  if ((ulong)uVar3 != 0) {
    uVar20 = 0;
    do {
      _Var5._M_t.
      super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
      super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
           (this->in_point_cloud_->attributes_).
           super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar9]._M_t.
           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
           ._M_t;
      if (*(char *)((long)_Var5._M_t.
                          super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                          .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + 100)
          == '\x01') {
        uVar14 = uVar20 & 0xffffffff;
      }
      else {
        uVar14 = (ulong)*(uint *)(*(long *)((long)_Var5._M_t.
                                                  super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                                  .
                                                  super__Head_base<0UL,_draco::PointAttribute_*,_false>
                                                  ._M_head_impl + 0x48) + uVar20 * 4);
      }
      pEVar4 = this->out_buffer_;
      if (pEVar4->bit_encoder_reserved_bytes_ < 1) {
        lVar15 = uVar14 * *(long *)((long)_Var5._M_t.
                                          super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                          .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                          _M_head_impl + 0x28) +
                 **(long **)_Var5._M_t.
                            super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                            .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl +
                 *(long *)((long)_Var5._M_t.
                                 super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                 .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl
                          + 0x30);
        std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                  ((vector<char,std::allocator<char>> *)pEVar4,
                   (pEVar4->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish,lVar15,
                   *(long *)((long)_Var5._M_t.
                                   super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                   .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                   _M_head_impl + 0x28) + lVar15);
      }
      if (-1 < (int)uVar10) {
        _Var5._M_t.
        super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
        .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
             (this->in_point_cloud_->attributes_).
             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[local_1e8]._M_t.
             super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
             ._M_t;
        if (*(char *)((long)_Var5._M_t.
                            super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                            .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl +
                     100) == '\x01') {
          uVar14 = uVar20 & 0xffffffff;
        }
        else {
          uVar14 = (ulong)*(uint *)(*(long *)((long)_Var5._M_t.
                                                                                                        
                                                  super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                                  .
                                                  super__Head_base<0UL,_draco::PointAttribute_*,_false>
                                                  ._M_head_impl + 0x48) + uVar20 * 4);
        }
        pEVar4 = this->out_buffer_;
        if (pEVar4->bit_encoder_reserved_bytes_ < 1) {
          lVar15 = uVar14 * *(long *)((long)_Var5._M_t.
                                            super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                            .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                            _M_head_impl + 0x28) +
                   **(long **)_Var5._M_t.
                              super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                              .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl +
                   *(long *)((long)_Var5._M_t.
                                   super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                   .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                   _M_head_impl + 0x30);
          std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                    ((vector<char,std::allocator<char>> *)pEVar4,
                     (pEVar4->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,lVar15,
                     *(long *)((long)_Var5._M_t.
                                     super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                     .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                     _M_head_impl + 0x28) + lVar15);
        }
      }
      if (-1 < (int)local_1ec) {
        _Var5._M_t.
        super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
        .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
             (this->in_point_cloud_->attributes_).
             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar22]._M_t.
             super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
             ._M_t;
        if (*(char *)((long)_Var5._M_t.
                            super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                            .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl +
                     100) == '\x01') {
          uVar14 = uVar20 & 0xffffffff;
        }
        else {
          uVar14 = (ulong)*(uint *)(*(long *)((long)_Var5._M_t.
                                                                                                        
                                                  super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                                  .
                                                  super__Head_base<0UL,_draco::PointAttribute_*,_false>
                                                  ._M_head_impl + 0x48) + uVar20 * 4);
        }
        pEVar4 = this->out_buffer_;
        if (pEVar4->bit_encoder_reserved_bytes_ < 1) {
          lVar15 = uVar14 * *(long *)((long)_Var5._M_t.
                                            super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                            .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                            _M_head_impl + 0x28) +
                   **(long **)_Var5._M_t.
                              super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                              .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl +
                   *(long *)((long)_Var5._M_t.
                                   super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                   .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                   _M_head_impl + 0x30);
          std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                    ((vector<char,std::allocator<char>> *)pEVar4,
                     (pEVar4->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,lVar15,
                     *(long *)((long)_Var5._M_t.
                                     super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                     .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                     _M_head_impl + 0x28) + lVar15);
        }
      }
      uVar20 = uVar20 + 1;
    } while (uVar3 != uVar20);
  }
  uVar17 = 1;
  if ((this->in_mesh_ != (Mesh *)0x0) &&
     ((int)((ulong)((long)(this->in_mesh_->faces_).vector_.
                          super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->in_mesh_->faces_).vector_.
                         super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555 != 0)) {
    local_1e0 = (ulong)local_1fc;
    uVar22 = 0;
    uVar9 = 0;
    do {
      pEVar4 = this->out_buffer_;
      local_1fd = 3;
      local_1ec = uVar9;
      if (pEVar4->bit_encoder_reserved_bytes_ < 1) {
        std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                  ((vector<char,std::allocator<char>> *)pEVar4,
                   (pEVar4->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_1fd,&local_1fc);
      }
      pMVar13 = this->in_mesh_;
      paVar6 = (pMVar13->faces_).vector_.
               super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar21 = (uint *)((long)&paVar6->_M_elems[0].value_ + uVar22);
      uVar20 = 0xffffffffffffffff;
      do {
        if (uVar3 <= *puVar21) {
          uVar17 = 0;
          goto LAB_0011ef26;
        }
        pEVar4 = this->out_buffer_;
        if (pEVar4->bit_encoder_reserved_bytes_ < 1) {
          std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                    ((vector<char,std::allocator<char>> *)pEVar4,
                     (pEVar4->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,puVar21,puVar21 + 1);
          pMVar13 = extraout_RAX;
        }
        uVar20 = uVar20 + 1;
        puVar21 = puVar21 + 1;
      } while (uVar20 != 2);
      local_1f8._M_head_impl._0_4_ = (int)CONCAT71((int7)((ulong)pMVar13 >> 8),1 < uVar20);
      local_1e8 = uVar22;
      if (-1 < (int)local_1fc) {
        pEVar4 = this->out_buffer_;
        local_1fd = 6;
        if (pEVar4->bit_encoder_reserved_bytes_ < 1) {
          std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                    ((vector<char,std::allocator<char>> *)pEVar4,
                     (pEVar4->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_1fd,&local_1fc);
        }
        uVar22 = local_1e8;
        _Var5._M_t.
        super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
        .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
             (this->in_point_cloud_->attributes_).
             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[local_1e0]._M_t.
             super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
             ._M_t;
        lVar15 = 0;
        do {
          uVar9 = *(uint *)((long)(paVar6->_M_elems + lVar15) + uVar22);
          if (*(char *)((long)_Var5._M_t.
                              super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                              .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl +
                       100) == '\0') {
            uVar9 = *(uint *)(*(long *)((long)_Var5._M_t.
                                              super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                              .super__Head_base<0UL,_draco::PointAttribute_*,_false>
                                              ._M_head_impl + 0x48) + (ulong)uVar9 * 4);
          }
          pEVar4 = this->out_buffer_;
          if (pEVar4->bit_encoder_reserved_bytes_ < 1) {
            lVar16 = (ulong)uVar9 *
                     *(long *)((long)_Var5._M_t.
                                     super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                     .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                     _M_head_impl + 0x28) +
                     **(long **)_Var5._M_t.
                                super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl
                     + *(long *)((long)_Var5._M_t.
                                       super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                       .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                       _M_head_impl + 0x30);
            std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                      ((vector<char,std::allocator<char>> *)pEVar4,
                       (pEVar4->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish,lVar16,
                       *(long *)((long)_Var5._M_t.
                                       super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                       .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                       _M_head_impl + 0x28) + lVar16);
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != 3);
      }
      uVar9 = local_1ec + 1;
      uVar22 = local_1e8 + 0xc;
      uVar17 = local_1f8._M_head_impl._0_1_;
    } while (uVar9 < (uint)((int)((ulong)((long)(this->in_mesh_->faces_).vector_.
                                                super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(this->in_mesh_->faces_).vector_.
                                               super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                           -0x55555555));
  }
LAB_0011ef26:
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
LAB_0011ef41:
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return (bool)uVar17;
}

Assistant:

bool PlyEncoder::EncodeInternal() {
  // Write PLY header.
  // TODO(ostava): Currently works only for xyz positions and rgb(a) colors.
  std::stringstream out;
  out << "ply" << std::endl;
  out << "format binary_little_endian 1.0" << std::endl;
  out << "element vertex " << in_point_cloud_->num_points() << std::endl;

  const int pos_att_id =
      in_point_cloud_->GetNamedAttributeId(GeometryAttribute::POSITION);
  int normal_att_id =
      in_point_cloud_->GetNamedAttributeId(GeometryAttribute::NORMAL);
  int tex_coord_att_id =
      in_point_cloud_->GetNamedAttributeId(GeometryAttribute::TEX_COORD);
  const int color_att_id =
      in_point_cloud_->GetNamedAttributeId(GeometryAttribute::COLOR);

  if (pos_att_id < 0) {
    return false;
  }

  // Ensure normals are 3 component. Don't encode them otherwise.
  if (normal_att_id >= 0 &&
      in_point_cloud_->attribute(normal_att_id)->num_components() != 3) {
    normal_att_id = -1;
  }

  // Ensure texture coordinates have only 2 components. Don't encode them
  // otherwise. TODO(ostava): Add support for 3 component normals (uvw).
  if (tex_coord_att_id >= 0 &&
      in_point_cloud_->attribute(tex_coord_att_id)->num_components() != 2) {
    tex_coord_att_id = -1;
  }

  out << "property " << GetAttributeDataType(pos_att_id) << " x" << std::endl;
  out << "property " << GetAttributeDataType(pos_att_id) << " y" << std::endl;
  out << "property " << GetAttributeDataType(pos_att_id) << " z" << std::endl;
  if (normal_att_id >= 0) {
    out << "property " << GetAttributeDataType(normal_att_id) << " nx"
        << std::endl;
    out << "property " << GetAttributeDataType(normal_att_id) << " ny"
        << std::endl;
    out << "property " << GetAttributeDataType(normal_att_id) << " nz"
        << std::endl;
  }
  if (color_att_id >= 0) {
    const auto *const attribute = in_point_cloud_->attribute(color_att_id);
    if (attribute->num_components() > 0) {
      out << "property " << GetAttributeDataType(color_att_id) << " red"
          << std::endl;
    }
    if (attribute->num_components() > 1) {
      out << "property " << GetAttributeDataType(color_att_id) << " green"
          << std::endl;
    }
    if (attribute->num_components() > 2) {
      out << "property " << GetAttributeDataType(color_att_id) << " blue"
          << std::endl;
    }
    if (attribute->num_components() > 3) {
      out << "property " << GetAttributeDataType(color_att_id) << " alpha"
          << std::endl;
    }
  }
  if (in_mesh_) {
    out << "element face " << in_mesh_->num_faces() << std::endl;
    out << "property list uchar int vertex_indices" << std::endl;
    if (tex_coord_att_id >= 0) {
      // Texture coordinates are usually encoded in the property list (one value
      // per corner).
      out << "property list uchar " << GetAttributeDataType(tex_coord_att_id)
          << " texcoord" << std::endl;
    }
  }
  out << "end_header" << std::endl;

  // Not very efficient but the header should be small so just copy the stream
  // to a string.
  const std::string header_str = out.str();
  buffer()->Encode(header_str.data(), header_str.length());

  // Store point attributes.
  const int num_points = in_point_cloud_->num_points();
  for (PointIndex v(0); v < num_points; ++v) {
    const auto *const pos_att = in_point_cloud_->attribute(pos_att_id);
    buffer()->Encode(pos_att->GetAddress(pos_att->mapped_index(v)),
                     pos_att->byte_stride());
    if (normal_att_id >= 0) {
      const auto *const normal_att = in_point_cloud_->attribute(normal_att_id);
      buffer()->Encode(normal_att->GetAddress(normal_att->mapped_index(v)),
                       normal_att->byte_stride());
    }
    if (color_att_id >= 0) {
      const auto *const color_att = in_point_cloud_->attribute(color_att_id);
      buffer()->Encode(color_att->GetAddress(color_att->mapped_index(v)),
                       color_att->byte_stride());
    }
  }

  if (in_mesh_) {
    // Write face data.
    for (FaceIndex i(0); i < in_mesh_->num_faces(); ++i) {
      // Write the number of face indices (always 3).
      buffer()->Encode(static_cast<uint8_t>(3));

      const auto &f = in_mesh_->face(i);
      for (int c = 0; c < 3; ++c) {
        if (f[c] >= num_points) {
          // Invalid point stored on the |in_mesh_| face.
          return false;
        }
        buffer()->Encode(f[c]);
      }

      if (tex_coord_att_id >= 0) {
        // Two coordinates for every corner -> 6.
        buffer()->Encode(static_cast<uint8_t>(6));

        const auto *const tex_att =
            in_point_cloud_->attribute(tex_coord_att_id);
        for (int c = 0; c < 3; ++c) {
          buffer()->Encode(tex_att->GetAddress(tex_att->mapped_index(f[c])),
                           tex_att->byte_stride());
        }
      }
    }
  }
  return true;
}